

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void __thiscall pybind11::detail::generic_type::initialize(generic_type *this,type_record *rec)

{
  bool bVar1;
  PyObject *pPVar2;
  type_info *ptVar3;
  size_t sVar4;
  PyTypeObject *type;
  type_info *ptVar5;
  byte local_221;
  type_info *local_1e0;
  bool local_1a1;
  handle local_1a0;
  PyObject *local_198;
  handle local_190;
  byte local_181;
  undefined1 local_180 [7];
  bool parent_simple_ancestors;
  type_info *local_160;
  type_info *parent_tinfo;
  type_info **local_150;
  generic_type *local_148;
  type_info *local_140;
  type_info *tinfo;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  type_index local_d0;
  type_index local_c8;
  allocator<char> local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  byte local_41;
  str_attr_accessor local_40;
  PyObject *local_20;
  type_info *local_18;
  type_record *rec_local;
  generic_type *this_local;
  
  local_18 = (type_info *)rec;
  rec_local = (type_record *)this;
  bVar1 = handle::operator_cast_to_bool(&rec->scope);
  local_41 = 0;
  local_1a1 = false;
  if (bVar1) {
    local_20 = ((handle *)&local_18->type)->m_ptr;
    bVar1 = hasattr((handle)local_20,"__dict__");
    local_1a1 = false;
    if (bVar1) {
      object_api<pybind11::handle>::attr
                (&local_40,(object_api<pybind11::handle> *)local_18,"__dict__");
      local_41 = 1;
      local_1a1 = object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>
                  ::contains<char_const*const&>
                            ((object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>
                              *)&local_40,(char **)&local_18->cpptype);
    }
  }
  if ((local_41 & 1) != 0) {
    accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_40);
  }
  if (local_1a1 != false) {
    ptVar5 = local_18->cpptype;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,(char *)ptVar5,&local_b9)
    ;
    std::operator+(&local_98,"generic_type: cannot initialize type \"",&local_b8);
    std::operator+(&local_78,&local_98,"\": an object with that name is already defined");
    pybind11_fail(&local_78);
  }
  if ((*(byte *)&local_18->get_buffer_data >> 4 & 1) == 0) {
    ptVar5 = (type_info *)local_18->type_size;
    std::type_index::type_index(&local_d0,ptVar5);
    local_1e0 = get_global_type_info(&local_d0);
  }
  else {
    ptVar5 = (type_info *)local_18->type_size;
    std::type_index::type_index(&local_c8,ptVar5);
    local_1e0 = get_local_type_info(&local_c8);
  }
  if (local_1e0 == (type_info *)0x0) {
    pPVar2 = make_new_python_type((type_record *)local_18);
    (this->super_object).super_handle.m_ptr = pPVar2;
    ptVar3 = (type_info *)operator_new(0x98);
    ptVar3->get_buffer_data = (void *)0x0;
    ptVar3->module_local_load = (_func_void_ptr_PyObject_ptr_type_info_ptr *)0x0;
    ptVar3->direct_conversions =
         (vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_> *)0x0;
    ptVar3->get_buffer = (_func_buffer_info_ptr_PyObject_ptr_void_ptr *)0x0;
    (ptVar3->implicit_casts).
    super__Vector_base<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (ptVar3->implicit_casts).
    super__Vector_base<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (ptVar3->implicit_conversions).
    super__Vector_base<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (ptVar3->implicit_casts).
    super__Vector_base<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (ptVar3->implicit_conversions).
    super__Vector_base<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (ptVar3->implicit_conversions).
    super__Vector_base<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ptVar3->init_instance = (_func_void_instance_ptr_void_ptr *)0x0;
    ptVar3->dealloc = (_func_void_value_and_holder_ptr *)0x0;
    ptVar3->holder_size_in_ptrs = 0;
    ptVar3->operator_new = (_func_void_ptr_size_t *)0x0;
    ptVar3->type_size = 0;
    ptVar3->type_align = 0;
    ptVar3->type = (PyTypeObject *)0x0;
    ptVar3->cpptype = (type_info *)0x0;
    *(undefined8 *)&ptVar3->field_0x90 = 0;
    type_info::type_info(ptVar3);
    ptVar3->type = (PyTypeObject *)(this->super_object).super_handle.m_ptr;
    ptVar3->cpptype = (type_info *)local_18->type_size;
    ptVar3->type_size = local_18->type_align;
    ptVar3->type_align = local_18->holder_size_in_ptrs;
    ptVar3->operator_new = (_func_void_ptr_size_t *)local_18->init_instance;
    local_140 = ptVar3;
    sVar4 = size_in_ptrs((detail *)local_18->operator_new,(size_t)ptVar5);
    local_140->holder_size_in_ptrs = sVar4;
    local_140->init_instance = (_func_void_instance_ptr_void_ptr *)local_18->dealloc;
    local_140->dealloc =
         (_func_void_value_and_holder_ptr *)
         (local_18->implicit_conversions).
         super__Vector_base<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_140->field_0x90 = local_140->field_0x90 | 1;
    local_140->field_0x90 = local_140->field_0x90 | 2;
    local_140->field_0x90 =
         local_140->field_0x90 & 0xfb | *(byte *)&local_18->get_buffer_data >> 1 & 4;
    local_140->field_0x90 =
         local_140->field_0x90 & 0xf7 | (*(byte *)&local_18->get_buffer_data >> 4 & 1) << 3;
    parent_tinfo = local_18;
    local_150 = &local_140;
    local_148 = this;
    with_internals<pybind11::detail::generic_type::initialize(pybind11::detail::type_record_const&)::_lambda(pybind11::detail::internals&)_1_>
              ((anon_class_24_3_13231fe3 *)&parent_tinfo);
    sVar4 = list::size((list *)&(local_18->implicit_conversions).
                                super__Vector_base<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
                                ._M_impl.super__Vector_impl_data._M_finish);
    if ((sVar4 < 2) && (((ulong)local_18->get_buffer_data & 1) == 0)) {
      sVar4 = list::size((list *)&(local_18->implicit_conversions).
                                  super__Vector_base<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
                                  ._M_impl.super__Vector_impl_data._M_finish);
      if (sVar4 == 1) {
        list::operator[]((list_accessor *)local_180,
                         (list *)&(local_18->implicit_conversions).
                                  super__Vector_base<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,0);
        type = (PyTypeObject *)
               accessor<pybind11::detail::accessor_policies::list_item>::ptr
                         ((list_accessor *)local_180);
        ptVar3 = get_type_info(type);
        accessor<pybind11::detail::accessor_policies::list_item>::~accessor
                  ((accessor<pybind11::detail::accessor_policies::list_item> *)local_180);
        local_160 = ptVar3;
        if (ptVar3 == (type_info *)0x0) {
          __assert_fail("parent_tinfo != nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/pybind11/include/pybind11/pybind11.h"
                        ,0x5a2,
                        "void pybind11::detail::generic_type::initialize(const type_record &)");
        }
        local_181 = (byte)ptVar3->field_0x90 >> 1 & 1;
        local_140->field_0x90 = local_140->field_0x90 & 0xfd | local_181 << 1;
        local_221 = 0;
        if ((ptVar3->field_0x90 & 1) != 0) {
          local_221 = local_181;
        }
        ptVar3->field_0x90 = ptVar3->field_0x90 & 0xfe | local_221;
      }
    }
    else {
      mark_parents_nonsimple(this,local_140->type);
      local_140->field_0x90 = local_140->field_0x90 & 0xfd;
    }
    if ((*(byte *)&local_18->get_buffer_data >> 4 & 1) != 0) {
      local_140->module_local_load = type_caster_generic::local_load;
      handle::handle<_object_*,_0>(&local_190,(this->super_object).super_handle.m_ptr);
      capsule::capsule((capsule *)&local_1a0,local_140,(char *)0x0,(PyCapsule_Destructor)0x0);
      local_198 = local_1a0.m_ptr;
      setattr(local_190,"__pybind11_module_local_v4_clang_libstdcpp_cxxabi1002__",local_1a0);
      capsule::~capsule((capsule *)&local_1a0);
    }
    return;
  }
  ptVar5 = local_18->cpptype;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,(char *)ptVar5,(allocator<char> *)((long)&tinfo + 7));
  std::operator+(&local_110,"generic_type: type \"",&local_130);
  std::operator+(&local_f0,&local_110,"\" is already registered!");
  pybind11_fail(&local_f0);
}

Assistant:

void initialize(const type_record &rec) {
        if (rec.scope && hasattr(rec.scope, "__dict__")
            && rec.scope.attr("__dict__").contains(rec.name)) {
            pybind11_fail("generic_type: cannot initialize type \"" + std::string(rec.name)
                          + "\": an object with that name is already defined");
        }

        if ((rec.module_local ? get_local_type_info(*rec.type) : get_global_type_info(*rec.type))
            != nullptr) {
            pybind11_fail("generic_type: type \"" + std::string(rec.name)
                          + "\" is already registered!");
        }

        m_ptr = make_new_python_type(rec);

        /* Register supplemental type information in C++ dict */
        auto *tinfo = new detail::type_info();
        tinfo->type = (PyTypeObject *) m_ptr;
        tinfo->cpptype = rec.type;
        tinfo->type_size = rec.type_size;
        tinfo->type_align = rec.type_align;
        tinfo->operator_new = rec.operator_new;
        tinfo->holder_size_in_ptrs = size_in_ptrs(rec.holder_size);
        tinfo->init_instance = rec.init_instance;
        tinfo->dealloc = rec.dealloc;
        tinfo->simple_type = true;
        tinfo->simple_ancestors = true;
        tinfo->default_holder = rec.default_holder;
        tinfo->module_local = rec.module_local;

        with_internals([&](internals &internals) {
            auto tindex = std::type_index(*rec.type);
            tinfo->direct_conversions = &internals.direct_conversions[tindex];
            if (rec.module_local) {
                get_local_internals().registered_types_cpp[tindex] = tinfo;
            } else {
                internals.registered_types_cpp[tindex] = tinfo;
            }
            internals.registered_types_py[(PyTypeObject *) m_ptr] = {tinfo};
        });

        if (rec.bases.size() > 1 || rec.multiple_inheritance) {
            mark_parents_nonsimple(tinfo->type);
            tinfo->simple_ancestors = false;
        } else if (rec.bases.size() == 1) {
            auto *parent_tinfo = get_type_info((PyTypeObject *) rec.bases[0].ptr());
            assert(parent_tinfo != nullptr);
            bool parent_simple_ancestors = parent_tinfo->simple_ancestors;
            tinfo->simple_ancestors = parent_simple_ancestors;
            // The parent can no longer be a simple type if it has MI and has a child
            parent_tinfo->simple_type = parent_tinfo->simple_type && parent_simple_ancestors;
        }

        if (rec.module_local) {
            // Stash the local typeinfo and loader so that external modules can access it.
            tinfo->module_local_load = &type_caster_generic::local_load;
            setattr(m_ptr, PYBIND11_MODULE_LOCAL_ID, capsule(tinfo));
        }
    }